

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cow_guarded.hpp
# Opt level: O0

void __thiscall
gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter::operator()(deleter *this,int *ptr)

{
  cow_guarded<int,_std::timed_mutex> *this_00;
  bool bVar1;
  anon_class_16_1_629f9e6c local_38;
  undefined1 local_28 [8];
  shared_ptr<const_int> newPtr;
  int *ptr_local;
  deleter *this_local;
  
  newPtr.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ptr;
  if ((this->m_cancelled & 1U) == 0) {
    if (ptr != (int *)0x0) {
      std::shared_ptr<int_const>::shared_ptr<int,void>((shared_ptr<int_const> *)local_28,ptr);
      this_00 = this->m_guarded;
      std::shared_ptr<const_int>::shared_ptr(&local_38.newPtr,(shared_ptr<const_int> *)local_28);
      lr_guarded<std::shared_ptr<int_const>,std::mutex>::operator()
                ((lr_guarded<std::shared_ptr<int_const>,std::mutex> *)this_00,&local_38);
      cow_guarded<int,std::timed_mutex>::deleter::operator()(int*)::
      {lambda(std::shared_ptr<int_const>&)#1}::~shared_ptr
                ((_lambda_std__shared_ptr<int_const>___1_ *)&local_38);
      std::shared_ptr<const_int>::~shared_ptr((shared_ptr<const_int> *)local_28);
    }
  }
  else if (ptr != (int *)0x0) {
    operator_delete(ptr,4);
  }
  bVar1 = std::unique_lock<std::timed_mutex>::owns_lock(&this->m_lock);
  if (bVar1) {
    std::unique_lock<std::timed_mutex>::unlock(&this->m_lock);
  }
  return;
}

Assistant:

void operator()(T* ptr)
        {
            if (m_cancelled) {
                delete ptr;
            } else if (ptr) {
                std::shared_ptr<const T> newPtr(ptr);

                m_guarded.m_data.modify(
                    [newPtr](std::shared_ptr<const T>& sptr) {
                        sptr = newPtr;
                    });
            }

            if (m_lock.owns_lock()) {
                m_lock.unlock();
            }
        }